

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Gia_ManMarkWithTravId_rec(Gia_Man_t *p,int Id)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    pObj_00 = Gia_ManObj(p,Id);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0(pObj_00,Id);
      Gia_ManMarkWithTravId_rec(p,iVar1);
    }
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId1(pObj_00,Id);
      Gia_ManMarkWithTravId_rec(p,iVar1);
    }
  }
  return;
}

Assistant:

void Gia_ManMarkWithTravId_rec( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManMarkWithTravId_rec( p, Gia_ObjFaninId0(pObj, Id) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManMarkWithTravId_rec( p, Gia_ObjFaninId1(pObj, Id) );
}